

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

double ddCountMintermAux(DdNode *node,double max,DdHashTable *table)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  DdNode *pDVar4;
  double dVar5;
  double dVar6;
  ptrint fanout;
  DdNode *res;
  double minE;
  double minT;
  double min;
  DdNode *Ne;
  DdNode *Nt;
  DdNode *N;
  DdHashTable *table_local;
  double max_local;
  DdNode *node_local;
  
  piVar3 = (int *)((ulong)node & 0xfffffffffffffffe);
  if (*piVar3 == 0x7fffffff) {
    if ((node == background) || (node_local = (DdNode *)max, node == zero)) {
      node_local = (DdNode *)0x0;
    }
  }
  else if ((piVar3[1] == 1) || (pDVar4 = cuddHashTableLookup1(table,node), pDVar4 == (DdNode *)0x0))
  {
    Ne = *(DdNode **)(piVar3 + 4);
    min = *(double *)(piVar3 + 6);
    if (((ulong)node & 1) != 0) {
      Ne = (DdNode *)((ulong)Ne ^ 1);
      min = (double)((ulong)min ^ 1);
    }
    dVar5 = ddCountMintermAux(Ne,max,table);
    if ((dVar5 != -1.0) || (NAN(dVar5))) {
      dVar6 = ddCountMintermAux((DdNode *)min,max,table);
      if ((dVar6 != -1.0) || (NAN(dVar6))) {
        node_local = (DdNode *)(dVar5 * 0.5 + dVar6 * 0.5);
        if (piVar3[1] != 1) {
          uVar1 = piVar3[1];
          pDVar4 = cuddUniqueConst(table->manager,(double)node_local);
          iVar2 = cuddHashTableInsert1(table,node,pDVar4,(ulong)uVar1 - 1);
          if (iVar2 == 0) {
            *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) + 1;
            Cudd_RecursiveDeref(table->manager,pDVar4);
            node_local = (DdNode *)0xbff0000000000000;
          }
        }
      }
      else {
        node_local = (DdNode *)0xbff0000000000000;
      }
    }
    else {
      node_local = (DdNode *)0xbff0000000000000;
    }
  }
  else {
    node_local = (pDVar4->type).kids.T;
    if (pDVar4->ref == 0) {
      table->manager->dead = table->manager->dead + 1;
      (table->manager->constants).dead = (table->manager->constants).dead + 1;
    }
  }
  return (double)node_local;
}

Assistant:

static double
ddCountMintermAux(
  DdNode * node,
  double  max,
  DdHashTable * table)
{
    DdNode      *N, *Nt, *Ne;
    double      min, minT, minE;
    DdNode      *res;

    N = Cudd_Regular(node);

    if (cuddIsConstant(N)) {
        if (node == background || node == zero) {
            return(0.0);
        } else {
            return(max);
        }
    }
    if (N->ref != 1 && (res = cuddHashTableLookup1(table,node)) != NULL) {
        min = cuddV(res);
        if (res->ref == 0) {
            table->manager->dead++;
            table->manager->constants.dead++;
        }
        return(min);
    }

    Nt = cuddT(N); Ne = cuddE(N);
    if (Cudd_IsComplement(node)) {
        Nt = Cudd_Not(Nt); Ne = Cudd_Not(Ne);
    }

    minT = ddCountMintermAux(Nt,max,table);
    if (minT == (double)CUDD_OUT_OF_MEM) return((double)CUDD_OUT_OF_MEM);
    minT *= 0.5;
    minE = ddCountMintermAux(Ne,max,table);
    if (minE == (double)CUDD_OUT_OF_MEM) return((double)CUDD_OUT_OF_MEM);
    minE *= 0.5;
    min = minT + minE;

    if (N->ref != 1) {
        ptrint fanout = (ptrint) N->ref;
        cuddSatDec(fanout);
        res = cuddUniqueConst(table->manager,min);
        if (!cuddHashTableInsert1(table,node,res,fanout)) {
            cuddRef(res); Cudd_RecursiveDeref(table->manager, res);
            return((double)CUDD_OUT_OF_MEM);
        }
    }

    return(min);

}